

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedListPool.h
# Opt level: O2

void __thiscall
LinkedListPool<depspawn::internal::arg_info,_true,_false>::allocate
          (LinkedListPool<depspawn::internal::arg_info,_true,_false> *this)

{
  arg_info *paVar1;
  __atomic_flag_data_type _Var2;
  int iVar3;
  int iVar4;
  arg_info *paVar5;
  arg_info *last_datain;
  arg_info *h;
  
  iVar3 = this->chunkSize_;
  iVar4 = this->minTSize_;
  h = (arg_info *)malloc((long)(iVar4 * iVar3));
  last_datain = (arg_info *)((long)&h->addr + (long)((iVar3 + -1) * iVar4));
  paVar5 = h;
  do {
    paVar1 = (arg_info *)((long)&paVar5->addr + (long)iVar4);
    paVar5->array_range = (array_range_t *)0x0;
    paVar5->next = (arg_info *)0x0;
    paVar5->wr = false;
    paVar5->rank = '\0';
    *(undefined6 *)&paVar5->field_0x22 = 0;
    paVar5->addr = 0;
    paVar5->size = 0;
    paVar5->next = paVar1;
    paVar5 = paVar1;
  } while (paVar1 <= last_datain);
  do {
    LOCK();
    _Var2 = (this->pool_mutex_).super___atomic_flag_base._M_i;
    (this->pool_mutex_).super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var2 != false);
  std::vector<depspawn::internal::arg_info_*,_std::allocator<depspawn::internal::arg_info_*>_>::
  push_back(&this->v_,&h);
  freeLinkedList(this,h,last_datain,true);
  (this->pool_mutex_).super___atomic_flag_base._M_i = false;
  return;
}

Assistant:

void allocate() {
    char * baseptr = PoolAllocator_malloc_free<SCALABLE>::malloc(chunkSize_ * minTSize_);
    char * const endptr = baseptr +  minTSize_ * (chunkSize_ - 1);
    T * const h = reinterpret_cast<T *>(baseptr);
    T * const q = reinterpret_cast<T *>(endptr);
    T * p = h;
    do {
      baseptr += minTSize_;
      if (ALLOC_ONCE) {
        new (p) T();
      }
      p->next = reinterpret_cast<T *>(baseptr); //invalid for p=q. Will be corrected during linking
      p = static_cast<T *>(p->next);
    } while (baseptr <= endptr);
    
    while (pool_mutex_.test_and_set(std::memory_order_acquire));
    
    v_.push_back(h);

    freeLinkedList(h, q, true);
    
    pool_mutex_.clear(std::memory_order_release);
  }